

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MaterialSystem.cpp
# Opt level: O2

uint32_t Assimp::ComputeMaterialHash(aiMaterial *mat,bool includeMatName)

{
  aiMaterialProperty *paVar1;
  uint32_t uVar2;
  uint i;
  ulong uVar3;
  
  uVar2 = 0x5df;
  for (uVar3 = 0; uVar3 < mat->mNumProperties; uVar3 = uVar3 + 1) {
    paVar1 = mat->mProperties[uVar3];
    if ((paVar1 != (aiMaterialProperty *)0x0) &&
       ((includeMatName || ((paVar1->mKey).data[0] != '?')))) {
      uVar2 = SuperFastHash((paVar1->mKey).data,(paVar1->mKey).length,uVar2);
      uVar2 = SuperFastHash(paVar1->mData,paVar1->mDataLength,uVar2);
      uVar2 = SuperFastHash((char *)&paVar1->mSemantic,4,uVar2);
      uVar2 = SuperFastHash((char *)&paVar1->mIndex,4,uVar2);
    }
  }
  return uVar2;
}

Assistant:

uint32_t Assimp::ComputeMaterialHash(const aiMaterial* mat, bool includeMatName /*= false*/)
{
    uint32_t hash = 1503; // magic start value, chosen to be my birthday :-)
    for ( unsigned int i = 0; i < mat->mNumProperties; ++i ) {
        aiMaterialProperty* prop;

        // Exclude all properties whose first character is '?' from the hash
        // See doc for aiMaterialProperty.
        if ((prop = mat->mProperties[i]) && (includeMatName || prop->mKey.data[0] != '?'))  {

            hash = SuperFastHash(prop->mKey.data,(unsigned int)prop->mKey.length,hash);
            hash = SuperFastHash(prop->mData,prop->mDataLength,hash);

            // Combine the semantic and the index with the hash
            hash = SuperFastHash((const char*)&prop->mSemantic,sizeof(unsigned int),hash);
            hash = SuperFastHash((const char*)&prop->mIndex,sizeof(unsigned int),hash);
        }
    }
    return hash;
}